

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

RESTResponseFormat ParseDataFormat(string *param,string *strReq)

{
  int iVar1;
  undefined8 uVar2;
  size_type __n;
  size_type sVar3;
  RESTResponseFormat unaff_EBP;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  string suffix;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (strReq->_M_string_length == 0) {
LAB_0099549c:
    __n = 0xffffffffffffffff;
  }
  else {
    sVar3 = strReq->_M_string_length;
    do {
      __n = sVar3 - 1;
      if (sVar3 == 0) goto LAB_0099549c;
      lVar4 = sVar3 - 1;
      sVar3 = __n;
    } while ((strReq->_M_dataplus)._M_p[lVar4] != '?');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_58,strReq,0,__n);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (param,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (param->_M_string_length == 0) {
LAB_00995510:
    uVar5 = 0xffffffffffffffff;
  }
  else {
    sVar3 = param->_M_string_length;
    do {
      uVar5 = sVar3 - 1;
      if (sVar3 == 0) goto LAB_00995510;
      lVar4 = sVar3 - 1;
      sVar3 = uVar5;
    } while ((param->_M_dataplus)._M_p[lVar4] != '.');
  }
  if (uVar5 == 0xffffffffffffffff) {
    unaff_EBP = UNDEF;
  }
  else {
    std::__cxx11::string::string((string *)&local_58,param,uVar5 + 1,&local_59);
    lVar4 = 0;
    do {
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_58,*(char **)((long)&rf_names[0].name + lVar4));
      if (iVar1 == 0) {
        if (param->_M_string_length < uVar5) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar2 = std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                               "basic_string::erase",uVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar2);
            }
          }
          goto LAB_0099561f;
        }
        param->_M_string_length = uVar5;
        (param->_M_dataplus)._M_p[uVar5] = '\0';
        unaff_EBP = *(RESTResponseFormat *)((long)&rf_names[0].rf + lVar4);
      }
      if (iVar1 == 0) goto LAB_0099557b;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    unaff_EBP = UNDEF;
LAB_0099557b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return unaff_EBP;
  }
LAB_0099561f:
  __stack_chk_fail();
}

Assistant:

RESTResponseFormat ParseDataFormat(std::string& param, const std::string& strReq)
{
    // Remove query string (if any, separated with '?') as it should not interfere with
    // parsing param and data format
    param = strReq.substr(0, strReq.rfind('?'));
    const std::string::size_type pos_format{param.rfind('.')};

    // No format string is found
    if (pos_format == std::string::npos) {
        return rf_names[0].rf;
    }

    // Match format string to available formats
    const std::string suffix(param, pos_format + 1);
    for (const auto& rf_name : rf_names) {
        if (suffix == rf_name.name) {
            param.erase(pos_format);
            return rf_name.rf;
        }
    }

    // If no suffix is found, return RESTResponseFormat::UNDEF and original string without query string
    return rf_names[0].rf;
}